

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_TraceBleed(int damage,AActor *target)

{
  int iVar1;
  int iVar2;
  DAngle local_48;
  DAngle local_40;
  DVector3 local_38;
  
  if (target != (AActor *)0x0) {
    iVar1 = FRandom::operator()(&pr_tracebleed);
    iVar2 = FRandom::operator()(&pr_tracebleed);
    local_48.Degrees = (double)(iVar2 + -0x80) * 0.0054931640625;
    local_38.Z = target->Height * 0.5 + (target->__Pos).Z;
    local_38.X = (target->__Pos).X;
    local_38.Y = (target->__Pos).Y;
    local_40.Degrees = (double)iVar1 * 1.40625;
    P_TraceBleed(damage,&local_38,target,&local_40,&local_48);
  }
  return;
}

Assistant:

void P_TraceBleed(int damage, AActor *target)
{
	if (target != NULL)
	{
		DAngle angle = pr_tracebleed() * (360 / 256.);
		DAngle pitch = (pr_tracebleed() - 128) * (360 / 65536.);
		P_TraceBleed(damage, target->PosPlusZ(target->Height / 2), target, angle, pitch);
	}
}